

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaLoader::InternReadFile
          (ColladaLoader *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  pointer ppaVar17;
  pointer ppVar18;
  pointer ppaVar19;
  pointer ppaVar20;
  pointer ppaVar21;
  pointer ppaVar22;
  _Base_ptr __n;
  _Rb_tree_color _Var23;
  aiNode *paVar24;
  aiMetadata *paVar25;
  aiString *paVar26;
  aiMetadataEntry *__s;
  _Rb_tree_color *p_Var27;
  _Base_ptr p_Var28;
  runtime_error *this_00;
  aiScene *extraout_RDX;
  aiScene *extraout_RDX_00;
  uint uVar29;
  aiString *paVar30;
  ulong __n_00;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  SkeletonMeshBuilder hero;
  ColladaParser parser;
  undefined1 local_368 [24];
  pointer local_350;
  pointer local_340;
  pointer local_338;
  pointer local_328;
  ColladaParser local_318;
  
  std::__cxx11::string::_M_assign((string *)&this->mFileName);
  std::
  _Rb_tree<Assimp::ColladaMeshIndex,_std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>,_std::_Select1st<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
  ::clear(&(this->mMeshIndexByID)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::clear(&(this->mMaterialIndexByName)._M_t);
  ppaVar17 = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar17) {
    (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar17;
  }
  ppaVar17 = (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar17) {
    (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar17;
  }
  ppVar18 = (this->newMats).
            super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->newMats).
      super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar18) {
    (this->newMats).
    super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar18;
  }
  ppaVar19 = (this->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar19) {
    (this->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar19;
  }
  ppaVar20 = (this->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar20) {
    (this->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar20;
  }
  ppaVar21 = (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if ((this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar21) {
    (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar21;
  }
  ppaVar22 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar22) {
    (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar22;
  }
  ColladaParser::ColladaParser(&local_318,pIOHandler,pFile);
  if (local_318.mRootNode != (Node *)0x0) {
    std::
    vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
    ::reserve(&this->newMats,
              local_318.mMaterialLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count * 2);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
              (&this->mMeshes,
               local_318.mMeshLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count * 2);
    std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::reserve
              (&this->mCameras,
               local_318.mCameraLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<aiLight_*,_std::allocator<aiLight_*>_>::reserve
              (&this->mLights,
               local_318.mLightLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count);
    BuildMaterials(this,&local_318,extraout_RDX);
    paVar24 = BuildHierarchy(this,&local_318,local_318.mRootNode);
    pScene->mRootNode = paVar24;
    FillMaterials(this,&local_318,extraout_RDX_00);
    paVar24 = pScene->mRootNode;
    fVar1 = (paVar24->mTransformation).a1;
    fVar2 = (paVar24->mTransformation).a2;
    fVar31 = fVar2 * 0.0;
    fVar3 = (paVar24->mTransformation).a3;
    fVar39 = fVar3 * 0.0;
    fVar4 = (paVar24->mTransformation).a4;
    fVar37 = fVar1 * 0.0;
    fVar38 = fVar37 + fVar31;
    fVar42 = fVar4 * 0.0;
    fVar5 = (paVar24->mTransformation).b1;
    fVar6 = (paVar24->mTransformation).b2;
    fVar43 = fVar6 * 0.0;
    fVar7 = (paVar24->mTransformation).b3;
    fVar32 = fVar7 * 0.0;
    fVar8 = (paVar24->mTransformation).b4;
    fVar40 = fVar5 * 0.0;
    fVar41 = fVar40 + fVar43;
    fVar46 = fVar8 * 0.0;
    fVar9 = (paVar24->mTransformation).c1;
    fVar10 = (paVar24->mTransformation).c2;
    fVar47 = fVar10 * 0.0;
    fVar11 = (paVar24->mTransformation).c3;
    fVar33 = fVar11 * 0.0;
    fVar44 = fVar9 * 0.0;
    fVar45 = fVar44 + fVar47;
    fVar12 = (paVar24->mTransformation).c4;
    fVar48 = fVar12 * 0.0;
    fVar13 = (paVar24->mTransformation).d2;
    fVar34 = fVar13 * 0.0;
    fVar14 = (paVar24->mTransformation).d1;
    fVar49 = fVar14 * 0.0;
    fVar50 = fVar49 + fVar34;
    fVar15 = (paVar24->mTransformation).d3;
    fVar35 = fVar15 * 0.0;
    fVar16 = (paVar24->mTransformation).d4;
    fVar36 = fVar16 * 0.0;
    (paVar24->mTransformation).a1 = local_318.mUnitSize * fVar1 + fVar31 + fVar39 + fVar42;
    (paVar24->mTransformation).a2 = local_318.mUnitSize * fVar2 + fVar37 + fVar39 + fVar42;
    (paVar24->mTransformation).a3 = fVar3 * local_318.mUnitSize + fVar38 + fVar42;
    (paVar24->mTransformation).a4 = fVar38 + fVar39 + fVar4;
    (paVar24->mTransformation).b1 = local_318.mUnitSize * fVar5 + fVar43 + fVar32 + fVar46;
    (paVar24->mTransformation).b2 = fVar6 * local_318.mUnitSize + fVar40 + fVar32 + fVar46;
    (paVar24->mTransformation).b3 = fVar7 * local_318.mUnitSize + fVar41 + fVar46;
    (paVar24->mTransformation).b4 = fVar41 + fVar32 + fVar8;
    (paVar24->mTransformation).c1 = local_318.mUnitSize * fVar9 + fVar47 + fVar33 + fVar48;
    (paVar24->mTransformation).c2 = fVar10 * local_318.mUnitSize + fVar44 + fVar33 + fVar48;
    (paVar24->mTransformation).c3 = fVar11 * local_318.mUnitSize + fVar45 + fVar48;
    (paVar24->mTransformation).c4 = fVar45 + fVar33 + fVar12;
    (paVar24->mTransformation).d1 = local_318.mUnitSize * fVar14 + fVar34 + fVar35 + fVar36;
    (paVar24->mTransformation).d2 = fVar13 * local_318.mUnitSize + fVar49 + fVar35 + fVar36;
    (paVar24->mTransformation).d3 = local_318.mUnitSize * fVar15 + fVar50 + fVar36;
    (paVar24->mTransformation).d4 = fVar50 + fVar35 + fVar16;
    if (this->ignoreUpDirection == false) {
      if (local_318.mUpDirection == UP_Z) {
        paVar24 = pScene->mRootNode;
        fVar1 = (paVar24->mTransformation).a1;
        fVar2 = (paVar24->mTransformation).a2;
        fVar39 = fVar2 * 0.0;
        fVar3 = (paVar24->mTransformation).a3;
        fVar41 = fVar1 * 0.0;
        fVar40 = fVar39 + fVar41;
        fVar31 = fVar3 * 0.0;
        fVar4 = (paVar24->mTransformation).a4;
        fVar36 = fVar4 * 0.0;
        fVar5 = (paVar24->mTransformation).b1;
        fVar6 = (paVar24->mTransformation).b2;
        fVar43 = fVar6 * 0.0;
        fVar7 = (paVar24->mTransformation).b3;
        fVar42 = fVar5 * 0.0;
        fVar44 = fVar43 + fVar42;
        fVar32 = fVar7 * 0.0;
        fVar8 = (paVar24->mTransformation).b4;
        fVar37 = fVar8 * 0.0;
        fVar9 = (paVar24->mTransformation).c1;
        fVar10 = (paVar24->mTransformation).c2;
        fVar46 = fVar10 * 0.0;
        fVar11 = (paVar24->mTransformation).c3;
        fVar45 = fVar9 * 0.0;
        fVar47 = fVar46 + fVar45;
        fVar33 = fVar11 * 0.0;
        fVar12 = (paVar24->mTransformation).c4;
        fVar38 = fVar12 * 0.0;
        fVar13 = (paVar24->mTransformation).d1;
        fVar14 = (paVar24->mTransformation).d2;
        fVar49 = fVar14 * 0.0;
        fVar48 = fVar13 * 0.0;
        fVar50 = fVar49 + fVar48;
        fVar15 = (paVar24->mTransformation).d3;
        fVar34 = fVar15 * 0.0;
        fVar16 = (paVar24->mTransformation).d4;
        fVar35 = fVar16 * 0.0;
        (paVar24->mTransformation).a1 = fVar1 + fVar39 + fVar31 + fVar36;
        (paVar24->mTransformation).a2 = (fVar40 - fVar3) + fVar36;
        (paVar24->mTransformation).a3 = fVar41 + fVar2 + fVar31 + fVar36;
        (paVar24->mTransformation).a4 = fVar40 + fVar31 + fVar4;
        (paVar24->mTransformation).b1 = fVar5 + fVar43 + fVar32 + fVar37;
        (paVar24->mTransformation).b2 = (fVar44 - fVar7) + fVar37;
        (paVar24->mTransformation).b3 = fVar42 + fVar6 + fVar32 + fVar37;
        (paVar24->mTransformation).b4 = fVar44 + fVar32 + fVar8;
        (paVar24->mTransformation).c1 = fVar9 + fVar46 + fVar33 + fVar38;
        (paVar24->mTransformation).c2 = (fVar47 - fVar11) + fVar38;
        (paVar24->mTransformation).c3 = fVar45 + fVar10 + fVar33 + fVar38;
        (paVar24->mTransformation).c4 = fVar47 + fVar33 + fVar12;
        (paVar24->mTransformation).d1 = fVar13 + fVar49 + fVar34 + fVar35;
        (paVar24->mTransformation).d2 = (fVar50 - fVar15) + fVar35;
        (paVar24->mTransformation).d3 = fVar48 + fVar14 + fVar34 + fVar35;
        (paVar24->mTransformation).d4 = fVar50 + fVar34 + fVar16;
      }
      else if (local_318.mUpDirection == UP_X) {
        paVar24 = pScene->mRootNode;
        fVar1 = (paVar24->mTransformation).a1;
        fVar2 = (paVar24->mTransformation).a2;
        fVar36 = fVar1 * 0.0;
        fVar3 = (paVar24->mTransformation).a3;
        fVar33 = fVar3 * 0.0;
        fVar4 = (paVar24->mTransformation).a4;
        fVar42 = fVar2 * 0.0;
        fVar37 = fVar36 + fVar42;
        fVar38 = fVar4 * 0.0;
        fVar5 = (paVar24->mTransformation).b1;
        fVar6 = (paVar24->mTransformation).b2;
        fVar39 = fVar5 * 0.0;
        fVar7 = (paVar24->mTransformation).b3;
        fVar34 = fVar7 * 0.0;
        fVar8 = (paVar24->mTransformation).b4;
        fVar41 = fVar6 * 0.0;
        fVar40 = fVar39 + fVar41;
        fVar43 = fVar8 * 0.0;
        fVar9 = (paVar24->mTransformation).c1;
        fVar10 = (paVar24->mTransformation).c2;
        fVar44 = fVar9 * 0.0;
        fVar11 = (paVar24->mTransformation).c3;
        fVar35 = fVar11 * 0.0;
        fVar12 = (paVar24->mTransformation).c4;
        fVar46 = fVar10 * 0.0;
        fVar45 = fVar44 + fVar46;
        fVar47 = fVar12 * 0.0;
        fVar13 = (paVar24->mTransformation).d1;
        fVar14 = (paVar24->mTransformation).d2;
        fVar48 = fVar13 * 0.0;
        fVar15 = (paVar24->mTransformation).d3;
        fVar32 = fVar15 * 0.0;
        fVar50 = fVar14 * 0.0;
        fVar49 = fVar48 + fVar50;
        fVar16 = (paVar24->mTransformation).d4;
        fVar31 = fVar16 * 0.0;
        (paVar24->mTransformation).a1 = fVar36 + fVar2 + fVar33 + fVar38;
        (paVar24->mTransformation).a2 = (fVar42 - fVar1) + fVar33 + fVar38;
        (paVar24->mTransformation).a3 = fVar3 + fVar37 + fVar38;
        (paVar24->mTransformation).a4 = fVar37 + fVar33 + fVar4;
        (paVar24->mTransformation).b1 = fVar39 + fVar6 + fVar34 + fVar43;
        (paVar24->mTransformation).b2 = (fVar41 - fVar5) + fVar34 + fVar43;
        (paVar24->mTransformation).b3 = fVar7 + fVar40 + fVar43;
        (paVar24->mTransformation).b4 = fVar40 + fVar34 + fVar8;
        (paVar24->mTransformation).c1 = fVar44 + fVar10 + fVar35 + fVar47;
        (paVar24->mTransformation).c2 = (fVar46 - fVar9) + fVar35 + fVar47;
        (paVar24->mTransformation).c3 = fVar11 + fVar45 + fVar47;
        (paVar24->mTransformation).c4 = fVar45 + fVar35 + fVar12;
        (paVar24->mTransformation).d1 = fVar48 + fVar14 + fVar32 + fVar31;
        (paVar24->mTransformation).d2 = (fVar50 - fVar13) + fVar32 + fVar31;
        (paVar24->mTransformation).d3 = fVar15 + fVar49 + fVar31;
        (paVar24->mTransformation).d4 = fVar49 + fVar32 + fVar16;
      }
    }
    if (local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      if ((uint)local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        paVar25 = (aiMetadata *)0x0;
      }
      else {
        paVar25 = (aiMetadata *)operator_new(0x18);
        paVar25->mKeys = (aiString *)0x0;
        paVar25->mValues = (aiMetadataEntry *)0x0;
        paVar25->mNumProperties =
             (uint)local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header._M_node_count;
        paVar26 = (aiString *)
                  operator_new__((local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count & 0xffffffff) * 0x404);
        paVar30 = paVar26;
        do {
          paVar30->length = 0;
          paVar30->data[0] = '\0';
          memset(paVar30->data + 1,0x1b,0x3ff);
          paVar30 = paVar30 + 1;
        } while (paVar30 !=
                 paVar26 + (local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count & 0xffffffff));
        paVar25->mKeys = paVar26;
        __n_00 = (ulong)paVar25->mNumProperties << 4;
        __s = (aiMetadataEntry *)operator_new__(__n_00);
        memset(__s,0,__n_00);
        paVar25->mValues = __s;
      }
      pScene->mMetaData = paVar25;
      if ((_Rb_tree_header *)
          local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header) {
        uVar29 = 0;
        p_Var28 = local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          paVar25 = pScene->mMetaData;
          if ((uVar29 < paVar25->mNumProperties) &&
             (__n = p_Var28[1]._M_parent, __n != (_Base_ptr)0x0)) {
            if (__n < (_Base_ptr)0x400) {
              paVar26 = paVar25->mKeys;
              paVar30 = paVar26 + uVar29;
              paVar30->length = (ai_uint32)__n;
              memcpy(paVar30->data,*(void **)(p_Var28 + 1),(size_t)__n);
              (&__n->field_0x4)[(long)(paVar26 + uVar29)] = 0;
            }
            paVar25->mValues[uVar29].mType = AI_AISTRING;
            p_Var27 = (_Rb_tree_color *)operator_new(0x404);
            _Var23 = p_Var28[2]._M_color;
            if (0x3fe < p_Var28[2]._M_color) {
              _Var23 = 0x3ff;
            }
            *p_Var27 = _Var23;
            memcpy(p_Var27 + 1,&p_Var28[2].field_0x4,(ulong)_Var23);
            *(undefined1 *)((long)p_Var27 + (ulong)_Var23 + 4) = 0;
            paVar25->mValues[uVar29].mData = p_Var27;
          }
          p_Var28 = (_Base_ptr)std::_Rb_tree_increment(p_Var28);
          uVar29 = uVar29 + 1;
        } while ((_Rb_tree_header *)p_Var28 !=
                 &local_318.mAssetMetaData._M_t._M_impl.super__Rb_tree_header);
      }
    }
    StoreSceneMeshes(this,pScene);
    StoreSceneMaterials(this,pScene);
    StoreSceneTextures(this,pScene);
    StoreSceneLights(this,pScene);
    StoreSceneCameras(this,pScene);
    StoreAnimations(this,pScene,&local_318);
    if (pScene->mNumMeshes == 0) {
      if (this->noSkeletonMesh == false) {
        SkeletonMeshBuilder::SkeletonMeshBuilder
                  ((SkeletonMeshBuilder *)local_368,pScene,(aiNode *)0x0,false);
        if (local_338 != (pointer)0x0) {
          operator_delete(local_338,(long)local_328 - (long)local_338);
        }
        if (local_350 != (pointer)0x0) {
          operator_delete(local_350,(long)local_340 - (long)local_350);
        }
        if ((pointer)local_368._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ - local_368._0_8_);
        }
      }
      *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 1;
    }
    ColladaParser::~ColladaParser(&local_318);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_368._0_8_ = local_368 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_368,"Collada: File came out empty. Something is wrong here.","");
  std::runtime_error::runtime_error(this_00,(string *)local_368);
  *(undefined ***)this_00 = &PTR__runtime_error_007fd498;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ColladaLoader::InternReadFile(const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    mFileName = pFile;

    // clean all member arrays - just for safety, it should work even if we did not
    mMeshIndexByID.clear();
    mMaterialIndexByName.clear();
    mMeshes.clear();
    mTargetMeshes.clear();
    newMats.clear();
    mLights.clear();
    mCameras.clear();
    mTextures.clear();
    mAnims.clear();

    // parse the input file
    ColladaParser parser(pIOHandler, pFile);


    if( !parser.mRootNode) {
        throw DeadlyImportError( "Collada: File came out empty. Something is wrong here.");
    }

    // reserve some storage to avoid unnecessary reallocs
    newMats.reserve(parser.mMaterialLibrary.size()*2u);
    mMeshes.reserve(parser.mMeshLibrary.size()*2u);

    mCameras.reserve(parser.mCameraLibrary.size());
    mLights.reserve(parser.mLightLibrary.size());

    // create the materials first, for the meshes to find
    BuildMaterials(parser, pScene);

    // build the node hierarchy from it
    pScene->mRootNode = BuildHierarchy(parser, parser.mRootNode);

    // ... then fill the materials with the now adjusted settings
    FillMaterials(parser, pScene);

    // Apply unit-size scale calculation

    pScene->mRootNode->mTransformation *= aiMatrix4x4(parser.mUnitSize, 0,  0,  0,
                                                        0,  parser.mUnitSize,  0,  0,
                                                        0,  0,  parser.mUnitSize,  0,
                                                        0,  0,  0,  1);
    if( !ignoreUpDirection ) {
        // Convert to Y_UP, if different orientation
        if( parser.mUpDirection == ColladaParser::UP_X) {
            pScene->mRootNode->mTransformation *= aiMatrix4x4(
                    0, -1,  0,  0,
                    1,  0,  0,  0,
                    0,  0,  1,  0,
                    0,  0,  0,  1);
        } else if( parser.mUpDirection == ColladaParser::UP_Z) {
            pScene->mRootNode->mTransformation *= aiMatrix4x4(
                    1,  0,  0,  0,
                    0,  0,  1,  0,
                    0, -1,  0,  0,
                    0,  0,  0,  1);
        }
    }

    // Store scene metadata
    if (!parser.mAssetMetaData.empty()) {
        const size_t numMeta(parser.mAssetMetaData.size());
        pScene->mMetaData = aiMetadata::Alloc(static_cast<unsigned int>(numMeta));
        size_t i = 0;
        for (auto it = parser.mAssetMetaData.cbegin(); it != parser.mAssetMetaData.cend(); ++it, ++i) {
            pScene->mMetaData->Set(static_cast<unsigned int>(i), (*it).first, (*it).second);
        }
    }

    // store all meshes
    StoreSceneMeshes(pScene);

    // store all materials
    StoreSceneMaterials(pScene);

    // store all textures
    StoreSceneTextures(pScene);

    // store all lights
    StoreSceneLights(pScene);

    // store all cameras
    StoreSceneCameras(pScene);

    // store all animations
    StoreAnimations(pScene, parser);

    // If no meshes have been loaded, it's probably just an animated skeleton.
    if ( 0u == pScene->mNumMeshes) {

        if (!noSkeletonMesh) {
            SkeletonMeshBuilder hero(pScene);
        }
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }
}